

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

uint32_t read_filter_data(rar5 *rar,uint32_t offset)

{
  uint32_t uVar1;
  uint8_t local_18 [4];
  uint32_t local_14;
  uint8_t linear_buf [4];
  uint32_t offset_local;
  rar5 *rar_local;
  
  local_14 = offset;
  _linear_buf = rar;
  circular_memcpy(local_18,(rar->cstate).window_buf,(rar->cstate).window_mask,(ulong)offset,
                  (ulong)(offset + 4));
  uVar1 = archive_le32dec(local_18);
  return uVar1;
}

Assistant:

static uint32_t read_filter_data(struct rar5* rar, uint32_t offset) {
	uint8_t linear_buf[4];
	circular_memcpy(linear_buf, rar->cstate.window_buf,
	    rar->cstate.window_mask, offset, offset + 4);
	return archive_le32dec(linear_buf);
}